

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolylineCurve::Evaluate
          (ON_PolylineCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  double dVar1;
  double dVar2;
  double d_00;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ON_3dPoint *pOVar6;
  ON_3dPoint *p_00;
  double local_128;
  int local_110;
  int local_e4;
  undefined1 local_e0 [4];
  int di;
  undefined1 local_c8 [8];
  ON_3dVector d;
  ON_3dPoint local_98;
  undefined1 local_80 [8];
  ON_3dPoint p;
  double s;
  double t1;
  double t0;
  double a;
  int local_40;
  int segment_index;
  int count;
  bool rc;
  int *hint_local;
  double *pdStack_28;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  ON_PolylineCurve *this_local;
  
  segment_index._3_1_ = 0;
  _count = hint;
  hint_local._4_4_ = side;
  pdStack_28 = v;
  v_local._0_4_ = v_stride;
  v_local._4_4_ = der_count;
  _v_stride_local = t;
  t_local = (double)this;
  iVar4 = PointCount(this);
  if (1 < iVar4) {
    local_40 = iVar4;
    pdVar5 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
    if (_count == (int *)0x0) {
      local_110 = 0;
    }
    else {
      local_110 = *_count;
    }
    a._4_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar5,_v_stride_local,hint_local._4_4_,local_110);
    iVar4 = hint_local._4_4_;
    if ((hint_local._4_4_ == -2) || (hint_local._4_4_ == 2)) {
      t0 = _v_stride_local;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,a._4_4_);
      dVar1 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,a._4_4_ + 1);
      bVar3 = ON_TuneupEvaluationParameter(iVar4,dVar1,*pdVar5,&t0);
      iVar4 = local_40;
      if (bVar3) {
        _v_stride_local = t0;
        pdVar5 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
        a._4_4_ = ON_NurbsSpanIndex(2,iVar4,pdVar5,_v_stride_local,hint_local._4_4_,a._4_4_);
      }
    }
    pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,a._4_4_);
    dVar1 = *pdVar5;
    pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,a._4_4_ + 1);
    dVar2 = *pdVar5;
    if ((_v_stride_local != dVar2) || (NAN(_v_stride_local) || NAN(dVar2))) {
      local_128 = (_v_stride_local - dVar1) / (dVar2 - dVar1);
    }
    else {
      local_128 = 1.0;
    }
    p.z = local_128;
    pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,a._4_4_);
    ::operator*(&local_98,1.0 - local_128,pOVar6);
    d_00 = p.z;
    pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,a._4_4_ + 1);
    ::operator*((ON_3dPoint *)&d.z,d_00,pOVar6);
    ON_3dPoint::operator+((ON_3dPoint *)local_80,&local_98,(ON_3dPoint *)&d.z);
    *pdStack_28 = (double)local_80;
    pdStack_28[1] = p.x;
    if (this->m_dim == 3) {
      pdStack_28[2] = p.y;
    }
    if (0 < v_local._4_4_) {
      pdStack_28 = pdStack_28 + (int)v_local;
      pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                         ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,a._4_4_ + 1);
      p_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                       ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,a._4_4_);
      ON_3dPoint::operator-((ON_3dVector *)local_e0,pOVar6,p_00);
      ::operator*((ON_3dVector *)local_c8,1.0 / (dVar2 - dVar1),(ON_3dVector *)local_e0);
      *pdStack_28 = (double)local_c8;
      pdStack_28[1] = d.x;
      if (this->m_dim == 3) {
        pdStack_28[2] = d.y;
      }
    }
    for (local_e4 = 2; local_e4 <= v_local._4_4_; local_e4 = local_e4 + 1) {
      pdStack_28 = pdStack_28 + (int)v_local;
      *pdStack_28 = 0.0;
      pdStack_28[1] = 0.0;
      if (this->m_dim == 3) {
        pdStack_28[2] = 0.0;
      }
    }
    if (_count != (int *)0x0) {
      *_count = a._4_4_;
    }
    segment_index._3_1_ = 1;
  }
  return (bool)(segment_index._3_1_ & 1);
}

Assistant:

bool 
ON_PolylineCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) 
  {
    int segment_index = ON_NurbsSpanIndex(2,count,m_t,t,side,(hint)?*hint:0);

    if ( -2 == side || 2 == side )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //   When evaluation passes through ON_CurveProxy or ON_PolyCurve reparamterization
      //   and the original side parameter was -1 or +1, it is changed to -2 or +2
      //   to indicate that if t is numerically closed to an end parameter, then
      //   it should be tuned up to be at the end parameter.
      double a = t;
      if ( ON_TuneupEvaluationParameter( side, m_t[segment_index], m_t[segment_index+1], &a) )
      {
        // recalculate segment index
        t = a;
        segment_index = ON_NurbsSpanIndex(2,count,m_t,t,side,segment_index);
      }
    }

    const double t0 = m_t[segment_index];
    const double t1 = m_t[segment_index+1];
    double s = (t == t1) ? 1.0 : (t-t0)/(t1-t0);
    const ON_3dPoint p = (1.0-s)*m_pline[segment_index] + s*m_pline[segment_index+1];
    v[0] = p.x;
    v[1] = p.y;
    if ( m_dim == 3 )
      v[2] = p.z;
    if ( der_count >= 1 ) {
      v += v_stride;
      ON_3dVector d = 1.0/(t1-t0)*(m_pline[segment_index+1] - m_pline[segment_index]);
      v[0] = d.x;
      v[1] = d.y;
      if ( m_dim == 3 )
        v[2] = d.z;
    }
    for ( int di = 2; di <= der_count; di++ ) {
      v += v_stride;
      v[0] = 0.0;
      v[1] = 0.0;
      if ( m_dim == 3 )
        v[2] = 0.0;
    }
    if ( hint )
      *hint = segment_index;
    rc = true;
  }
  return rc;
}